

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void set_rel_frame_dist(AV1_COMMON *cm,RefFrameDistanceInfo *ref_frame_dist_info,int ref_frame_flags
                       )

{
  int iVar1;
  int iVar2;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int dist;
  int min_future_dist;
  int min_past_dist;
  MV_REFERENCE_FRAME ref_frame;
  int local_20;
  int local_1c;
  char local_15;
  
  local_1c = 0x7fffffff;
  local_20 = 0x7fffffff;
  *(undefined1 *)(in_RSI + 0x1c) = 0xff;
  *(undefined1 *)(in_RSI + 0x1d) = 0xff;
  for (local_15 = '\x01'; local_15 < '\b'; local_15 = local_15 + '\x01') {
    *(undefined4 *)(in_RSI + (long)(local_15 + -1) * 4) = 0;
    if ((in_DL & ""[local_15]) != 0) {
      iVar1 = av1_encoder_get_relative_dist
                        (*(int *)(*(long *)(in_RDI + 0xe8) + 0x28 + (long)(local_15 + -1) * 4),
                         *(int *)(in_RDI + 8));
      *(int *)(in_RSI + (long)(local_15 + -1) * 4) = iVar1;
      iVar2 = iVar1;
      if (iVar1 < 1) {
        iVar2 = -iVar1;
      }
      if ((iVar2 < local_1c) && (iVar1 < 0)) {
        *(char *)(in_RSI + 0x1c) = local_15;
        local_1c = iVar1;
        if (iVar1 < 1) {
          local_1c = -iVar1;
        }
      }
      if ((iVar1 < local_20) && (0 < iVar1)) {
        *(char *)(in_RSI + 0x1d) = local_15;
        local_20 = iVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void set_rel_frame_dist(
    const AV1_COMMON *const cm, RefFrameDistanceInfo *const ref_frame_dist_info,
    const int ref_frame_flags) {
  MV_REFERENCE_FRAME ref_frame;
  int min_past_dist = INT32_MAX, min_future_dist = INT32_MAX;
  ref_frame_dist_info->nearest_past_ref = NONE_FRAME;
  ref_frame_dist_info->nearest_future_ref = NONE_FRAME;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    ref_frame_dist_info->ref_relative_dist[ref_frame - LAST_FRAME] = 0;
    if (ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      int dist = av1_encoder_get_relative_dist(
          cm->cur_frame->ref_display_order_hint[ref_frame - LAST_FRAME],
          cm->current_frame.display_order_hint);
      ref_frame_dist_info->ref_relative_dist[ref_frame - LAST_FRAME] = dist;
      // Get the nearest ref_frame in the past
      if (abs(dist) < min_past_dist && dist < 0) {
        ref_frame_dist_info->nearest_past_ref = ref_frame;
        min_past_dist = abs(dist);
      }
      // Get the nearest ref_frame in the future
      if (dist < min_future_dist && dist > 0) {
        ref_frame_dist_info->nearest_future_ref = ref_frame;
        min_future_dist = dist;
      }
    }
  }
}